

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_dform3D(DisasContext_conflict10 *ctx)

{
  int iVar1;
  TCGv_i64 pTVar2;
  TCGv_i64 pTVar3;
  TCGv_i64 EA;
  uint uVar4;
  uint uVar5;
  MemOp_conflict memop;
  TCGv_i64 val;
  TCGContext_conflict10 *tcg_ctx;
  uintptr_t o;
  TCGTemp *ts;
  uint32_t uStack_40;
  
  uVar4 = ctx->opcode;
  switch(uVar4 & 3) {
  case 0:
    if ((ctx->insns_flags2 & 0x20) == 0) {
LAB_009f41fc:
      gen_invalid(ctx);
      return;
    }
    if (ctx->fpu_enabled == false) {
      uStack_40 = 7;
      goto LAB_009f4465;
    }
    tcg_ctx = ctx->uc->tcg_ctx;
    gen_set_access_type(ctx,0x30);
    pTVar2 = tcg_temp_new_i64(tcg_ctx);
    pTVar3 = tcg_temp_new_i64(tcg_ctx);
    gen_addr_imm_index(ctx,pTVar2,0);
    uVar4 = ctx->opcode >> 0x15 & 0x1f;
    if (ctx->le_mode == true) {
      get_fpr(tcg_ctx,pTVar3,uVar4 + 1);
      gen_qemu_st64_i64(ctx,pTVar3,pTVar2);
      tcg_gen_addi_i64_ppc64(tcg_ctx,pTVar2,pTVar2,8);
      uVar4 = ctx->opcode >> 0x15 & 0x1f;
    }
    else {
      get_fpr(tcg_ctx,pTVar3,uVar4);
      gen_qemu_st64_i64(ctx,pTVar3,pTVar2);
      tcg_gen_addi_i64_ppc64(tcg_ctx,pTVar2,pTVar2,8);
      uVar4 = (ctx->opcode >> 0x15 & 0x1f) + 1;
    }
    get_fpr(tcg_ctx,pTVar3,uVar4);
    gen_qemu_st64_i64(ctx,pTVar3,pTVar2);
    break;
  case 1:
    if ((uVar4 & 5) == 5) {
      if ((ctx->insns_flags2 & 0x80000) == 0) goto LAB_009f41fc;
      tcg_ctx = ctx->uc->tcg_ctx;
      uVar5 = uVar4 * 4 & 0x20;
      if (uVar5 == 0) {
        if (ctx->vsx_enabled == false) goto LAB_009f4237;
      }
      else if (ctx->altivec_enabled == false) goto LAB_009f445f;
      uVar5 = uVar5 | uVar4 >> 0x15 & 0x1f;
      pTVar2 = tcg_temp_new_i64(tcg_ctx);
      pTVar3 = tcg_temp_new_i64(tcg_ctx);
      get_cpu_vsrh(tcg_ctx,pTVar2,uVar5);
      get_cpu_vsrl(tcg_ctx,pTVar3,uVar5);
      gen_set_access_type(ctx,0x20);
      EA = tcg_temp_new_i64(tcg_ctx);
      gen_addr_imm_index(ctx,EA,0xf);
      if (ctx->le_mode == true) {
        memop = MO_64;
        tcg_gen_qemu_st_i64_ppc64(tcg_ctx,pTVar3,EA,(long)ctx->mem_idx,MO_64);
        tcg_gen_addi_i64_ppc64(tcg_ctx,EA,EA,8);
        iVar1 = ctx->mem_idx;
        val = pTVar2;
      }
      else {
        memop = MO_BEQ;
        tcg_gen_qemu_st_i64_ppc64(tcg_ctx,pTVar2,EA,(long)ctx->mem_idx,MO_BEQ);
        tcg_gen_addi_i64_ppc64(tcg_ctx,EA,EA,8);
        iVar1 = ctx->mem_idx;
        val = pTVar3;
      }
      tcg_gen_qemu_st_i64_ppc64(tcg_ctx,val,EA,(long)iVar1,memop);
    }
    else {
      if (((uVar4 & 5) != 1) || ((ctx->insns_flags2 & 0x80000) == 0)) goto LAB_009f41fc;
      tcg_ctx = ctx->uc->tcg_ctx;
      uVar5 = uVar4 * 4 & 0x20;
      if (uVar5 == 0) {
        if (ctx->vsx_enabled == false) {
LAB_009f4237:
          uStack_40 = 0x5e;
          goto LAB_009f4465;
        }
      }
      else if (ctx->altivec_enabled == false) goto LAB_009f445f;
      uVar5 = uVar5 | uVar4 >> 0x15 & 0x1f;
      pTVar2 = tcg_temp_new_i64(tcg_ctx);
      pTVar3 = tcg_temp_new_i64(tcg_ctx);
      gen_set_access_type(ctx,0x20);
      EA = tcg_temp_new_i64(tcg_ctx);
      gen_addr_imm_index(ctx,EA,0xf);
      if (ctx->le_mode == true) {
        tcg_gen_qemu_ld_i64_ppc64(tcg_ctx,pTVar3,EA,(long)ctx->mem_idx,MO_64);
        set_cpu_vsrl(tcg_ctx,uVar5,pTVar3);
        tcg_gen_addi_i64_ppc64(tcg_ctx,EA,EA,8);
        tcg_gen_qemu_ld_i64_ppc64(tcg_ctx,pTVar2,EA,(long)ctx->mem_idx,MO_64);
        set_cpu_vsrh(tcg_ctx,uVar5,pTVar2);
      }
      else {
        tcg_gen_qemu_ld_i64_ppc64(tcg_ctx,pTVar2,EA,(long)ctx->mem_idx,MO_BEQ);
        set_cpu_vsrh(tcg_ctx,uVar5,pTVar2);
        tcg_gen_addi_i64_ppc64(tcg_ctx,EA,EA,8);
        tcg_gen_qemu_ld_i64_ppc64(tcg_ctx,pTVar3,EA,(long)ctx->mem_idx,MO_BEQ);
        set_cpu_vsrl(tcg_ctx,uVar5,pTVar3);
      }
    }
    tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(EA + (long)tcg_ctx));
    break;
  case 2:
    if ((ctx->insns_flags2 & 0x80000) == 0) goto LAB_009f41fc;
    if (ctx->altivec_enabled != false) {
      tcg_ctx = ctx->uc->tcg_ctx;
      pTVar2 = tcg_temp_new_i64(tcg_ctx);
      get_cpu_vsrh(tcg_ctx,pTVar2,ctx->opcode >> 0x15 & 0x1f | 0x20);
      gen_set_access_type(ctx,0x20);
      pTVar3 = tcg_temp_new_i64(tcg_ctx);
      gen_addr_imm_index(ctx,pTVar3,3);
      gen_qemu_st64_i64(ctx,pTVar2,pTVar3);
LAB_009f41a6:
      tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar3 + (long)tcg_ctx));
      ts = (TCGTemp *)(pTVar2 + (long)tcg_ctx);
      goto LAB_009f444c;
    }
    goto LAB_009f445f;
  case 3:
    if ((ctx->insns_flags2 & 0x80000) == 0) goto LAB_009f41fc;
    if (ctx->altivec_enabled != false) {
      tcg_ctx = ctx->uc->tcg_ctx;
      pTVar2 = tcg_temp_new_i64(tcg_ctx);
      get_cpu_vsrh(tcg_ctx,pTVar2,ctx->opcode >> 0x15 & 0x1f | 0x20);
      gen_set_access_type(ctx,0x20);
      pTVar3 = tcg_temp_new_i64(tcg_ctx);
      gen_addr_imm_index(ctx,pTVar3,3);
      gen_qemu_st32fs(ctx,pTVar2,pTVar3);
      goto LAB_009f41a6;
    }
LAB_009f445f:
    uStack_40 = 0x49;
LAB_009f4465:
    gen_exception(ctx,uStack_40);
    return;
  }
  tcg_temp_free_internal_ppc64(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  ts = (TCGTemp *)(pTVar3 + (long)tcg_ctx);
LAB_009f444c:
  tcg_temp_free_internal_ppc64(tcg_ctx,ts);
  return;
}

Assistant:

static void gen_dform3D(DisasContext *ctx)
{
    if ((ctx->opcode & 3) == 1) { /* DQ-FORM */
        switch (ctx->opcode & 0x7) {
        case 1: /* lxv */
            if (ctx->insns_flags2 & PPC2_ISA300) {
                return gen_lxv(ctx);
            }
            break;
        case 5: /* stxv */
            if (ctx->insns_flags2 & PPC2_ISA300) {
                return gen_stxv(ctx);
            }
            break;
        }
    } else { /* DS-FORM */
        switch (ctx->opcode & 0x3) {
        case 0: /* stfdp */
            if (ctx->insns_flags2 & PPC2_ISA205) {
                return gen_stfdp(ctx);
            }
            break;
        case 2: /* stxsd */
            if (ctx->insns_flags2 & PPC2_ISA300) {
                return gen_stxsd(ctx);
            }
            break;
        case 3: /* stxssp */
            if (ctx->insns_flags2 & PPC2_ISA300) {
                return gen_stxssp(ctx);
            }
            break;
        }
    }
    return gen_invalid(ctx);
}